

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  Territory TVar2;
  int iVar3;
  int iVar4;
  MapcodeError MVar5;
  MapcodeError MVar6;
  Territory TVar7;
  uint uVar8;
  uint uVar9;
  Territory TVar10;
  MapcodeError MVar11;
  int iVar12;
  unsigned_short *puVar13;
  size_t sVar14;
  TerritoryAlphabets *pTVar15;
  undefined4 extraout_var;
  FILE *__stream;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  __int32_t **pp_Var19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  int i_1;
  MapcodeError *pMVar23;
  Alphabet i;
  Alphabet AVar24;
  int iVar25;
  int iVar26;
  int i_3;
  long lVar27;
  int noMoreNames;
  uint uVar28;
  char **ppcVar29;
  TerritoryBoundary *pTVar30;
  double dVar31;
  double dVar32;
  undefined8 uVar33;
  int iStack_16030;
  int iStack_1601c;
  char s1_1 [1];
  undefined7 uStack_16017;
  unsigned_short u1 [1];
  double lon2;
  ulong uStack_15ff8;
  int iStack_15fec;
  undefined8 uStack_15fe8;
  long lStack_15fe0;
  double dStack_15fd8;
  double lat3;
  char s1 [1];
  unsigned_short largeUnicodeString2 [20000];
  char largeString2 [10000];
  unsigned_short largeUnicodeString1 [10000];
  
  puts("Mapcode C Library Unit Tests");
  printf("Library version %s (data version %s)\n","2.5.5","2.3.0");
  printf("Using up to %d threads to test in parallel...\n",0x10);
  if ((argc != 1) || (argv == (char **)0x0)) {
    puts("*** ERROR *** unittest takes no arguments!");
    exit(1);
  }
  puts("-----------------------------------------------------------\nEnvironment tests");
  printf("sizeof(char)=%ld, sizeof(UWORD)=%ld, sizeof(int)=%ld, sizeof(long int)=%ld char=%s\n",1,2,
         4,8,"signed");
  puts("-----------------------------------------------------------\nRobustness tests");
  testIncorrectGetTerritoryCode("UNKNOWN");
  testIncorrectGetTerritoryCode("A");
  testIncorrectGetTerritoryCode(" A");
  testIncorrectGetTerritoryCode("A ");
  testIncorrectGetTerritoryCode(" A ");
  testIncorrectGetTerritoryCode("AA");
  testIncorrectGetTerritoryCode(" AA");
  testIncorrectGetTerritoryCode("AA ");
  testIncorrectGetTerritoryCode(" AA ");
  testIncorrectGetTerritoryCode("US-");
  testIncorrectGetTerritoryCode(" US-");
  testIncorrectGetTerritoryCode("US- ");
  testIncorrectGetTerritoryCode(" US- ");
  testIncorrectGetTerritoryCode(" ");
  s1[0] = '\0';
  testIncorrectGetTerritoryCode(s1);
  for (lVar21 = 0; lVar21 != 15999; lVar21 = lVar21 + 1) {
    *(char *)((long)largeUnicodeString2 + lVar21) =
         (char)((ushort)lVar21 / 0xdf) * '!' + ' ' + (char)lVar21;
  }
  largeUnicodeString2[7999]._1_1_ = 0;
  testIncorrectGetTerritoryCode((char *)largeUnicodeString2);
  iVar3 = 1;
  testCorrectEncode(-90.0,0.0,1);
  testCorrectEncode(90.0,0.0,1);
  testCorrectEncode(-91.0,0.0,1);
  testCorrectEncode(91.0,0.0,1);
  testCorrectEncode(0.0,-180.0,1);
  testCorrectEncode(0.0,180.0,1);
  testCorrectEncode(1.0,-181.0,1);
  testCorrectEncode(0.0,181.0,1);
  testIncorrectEncode(0.0,NAN,iVar3);
  testIncorrectEncode(NAN,0.0,iVar3);
  testIncorrectEncode(NAN,NAN,iVar3);
  iVar3 = 0;
  testCorrectEncode(INFINITY,0.0,0);
  testIncorrectEncode(0.0,INFINITY,iVar3);
  testIncorrectEncode(INFINITY,INFINITY,iVar3);
  iVar3 = 0;
  testCorrectEncode(-INFINITY,0.0,0);
  testIncorrectEncode(0.0,-INFINITY,iVar3);
  testIncorrectEncode(-INFINITY,-INFINITY,iVar3);
  testCorrectEncode(1.79769313486232e+308,0.0,0);
  testCorrectEncode(0.0,1.79769313486232e+308,0);
  testCorrectEncode(1.79769313486232e+308,1.79769313486232e+308,0);
  testCorrectEncode(-1.79769313486232e+308,0.0,0);
  testCorrectEncode(0.0,-1.79769313486232e+308,0);
  testCorrectEncode(-1.79769313486232e+308,-1.79769313486232e+308,0);
  TVar2 = getTerritoryCode("NLD",TERRITORY_NONE);
  testIncorrectDecode("",TERRITORY_NONE);
  testIncorrectDecode(" ",TERRITORY_NONE);
  testIncorrectDecode("AA",TERRITORY_NONE);
  testIncorrectDecode("",TVar2);
  testIncorrectDecode(" ",TVar2);
  testIncorrectDecode("AA",TVar2);
  testIncorrectDecode("XX.XX",TERRITORY_NONE);
  testCorrectDecode("NLD XX.XX",TVar2);
  testCorrectDecode("NLD 39.UC",TVar2);
  testCorrectDecode("W9.SX9",TVar2);
  testCorrectDecode("MEX 49.4V",TVar2);
  testCorrectDecode("NLD XX.XX",TERRITORY_NONE);
  testCorrectDecode("MX XX.XX",TERRITORY_NONE);
  largeUnicodeString2[0]._0_1_ = 0;
  testIncorrectDecode((char *)largeUnicodeString2,TERRITORY_NONE);
  testIncorrectDecode((char *)largeUnicodeString2,TVar2);
  testIncorrectDecode((char *)largeUnicodeString2,TERRITORY_NONE);
  testIncorrectDecode((char *)largeUnicodeString2,TVar2);
  puts("-----------------------------------------------------------\nAlphabet tests");
  s1_1[0] = '\0';
  for (lVar21 = 0; lVar21 != 19999; lVar21 = lVar21 + 1) {
    s1[lVar21] = (char)((ushort)lVar21 / 0xdf) * '!' + ' ' + (char)lVar21;
  }
  for (lVar21 = 0; lVar21 != 9999; lVar21 = lVar21 + 1) {
    largeString2[lVar21] = (char)((ushort)lVar21 / 0xdf) * '!' + ' ' + (char)lVar21;
  }
  largeString2[9999] = '\0';
  uVar33 = 9999;
  for (AVar24 = ALPHABET_ROMAN; AVar24 != _ALPHABET_MAX; AVar24 = AVar24 + ALPHABET_GREEK) {
    puVar13 = convertMapcodeToAlphabetUtf16(u1,"",AVar24);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar13 != (unsigned_short *)0x0),(char *)(ulong)(uint)AVar24,(int)uVar33);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 must return empty string",(uint)(*puVar13 == 0),
               (char *)(ulong)(uint)AVar24,(int)uVar33);
    myConvertToRoman(s1_1,u1);
    testAlphabetAssertion
              ("myConvertToRoman must return empty string",(uint)(s1_1[0] == '\0'),
               (char *)(ulong)(uint)AVar24,(int)uVar33);
    puVar13 = convertMapcodeToAlphabetUtf16(largeUnicodeString1,s1,ALPHABET_ROMAN);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar13 != (unsigned_short *)0x0),(char *)(ulong)(uint)AVar24,(int)uVar33);
    myConvertToRoman(s1,puVar13);
    sVar14 = strlen(s1);
    testAlphabetAssertion
              ("myConvertToRoman must return size",(uint)(sVar14 < 20000),
               (char *)(ulong)(uint)AVar24,(int)uVar33);
    puVar13 = convertMapcodeToAlphabetUtf16(largeUnicodeString2,largeString2,ALPHABET_ROMAN);
    testAlphabetAssertion
              ("convertMapcodeToAlphabetUtf16 cannot return 0",
               (uint)(puVar13 != (unsigned_short *)0x0),(char *)(ulong)(uint)AVar24,(int)uVar33);
    myConvertToRoman(largeString2,puVar13);
    sVar14 = strlen(largeString2);
    testAlphabetAssertion
              ("myConvertToRoman must return size",(uint)(sVar14 < 10000),
               (char *)(ulong)(uint)AVar24,(int)uVar33);
  }
  printf("%d alphabets\n",0x1c);
  for (uVar22 = 0; uVar22 < 0xa4; uVar22 = uVar22 + 2) {
    pcVar16 = (&testAlphabets_TEST_PAIRS)[uVar22];
    pcVar17 = (&PTR_anon_var_dwarf_2ba7_002d9308)[uVar22];
    for (AVar24 = ALPHABET_ROMAN; AVar24 != _ALPHABET_MAX; AVar24 = AVar24 + ALPHABET_GREEK) {
      convertMapcodeToAlphabetUtf16((unsigned_short *)s1,pcVar16,AVar24);
      convertMapcodeToAlphabetUtf8((char *)largeUnicodeString2,pcVar16,AVar24);
      decodeMapcodeToLatLonUtf16
                ((double *)largeString2,(double *)u1,(unsigned_short *)s1,TERRITORY_FRA,
                 (MapcodeElements *)largeUnicodeString1);
      decodeMapcodeToLatLonUtf8
                ((double *)s1_1,&lon2,(char *)largeUnicodeString2,TERRITORY_FRA,
                 (MapcodeElements *)largeUnicodeString1);
      decodeMapcodeToLatLonUtf8
                (&lat3,&dStack_15fd8,pcVar16,TERRITORY_FRA,(MapcodeElements *)largeUnicodeString1);
      if ((((((double)largeString2._0_8_ != (double)CONCAT71(uStack_16017,s1_1[0])) ||
            (NAN((double)largeString2._0_8_) || NAN((double)CONCAT71(uStack_16017,s1_1[0])))) ||
           (_u1 != lon2)) || ((NAN(_u1) || NAN(lon2) || ((double)largeString2._0_8_ != lat3)))) ||
         (NAN((double)largeString2._0_8_) || NAN(lat3))) {
LAB_001ca4c5:
        foundError();
        printf("*** ERROR *** Difference in ascii/utf8/utf16 decoding %s\n",pcVar16);
      }
      else if ((_u1 != dStack_15fd8) || (NAN(_u1) || NAN(dStack_15fd8))) goto LAB_001ca4c5;
      myConvertToRoman((char *)largeUnicodeString2,(unsigned_short *)s1);
      iVar3 = strcmp((char *)largeUnicodeString2,pcVar17);
      if (iVar3 != 0) {
        foundError();
        printf("*** ERROR *** myConvertToRoman(convertMapcodeToAlphabetUtf16(\"%s\",%d))=\"%s\"\n",
               pcVar16,(ulong)(uint)AVar24,largeUnicodeString2);
      }
    }
  }
  puts("-----------------------------------------------------------\nAlphabet per territory tests");
  iVar3 = 0;
  for (TVar2 = TERRITORY_VAT; TVar2 != _TERRITORY_MAX; TVar2 = TVar2 + 1) {
    pTVar15 = getAlphabetsForTerritory(TVar2);
    if (pTVar15->count - 4U < 0xfffffffd) {
      foundError();
      printf("*** ERROR *** Bad getAlphabetsForTerritory(%d) count: %d\n",(ulong)(uint)TVar2,
             (ulong)(uint)pTVar15->count);
    }
    for (uVar22 = 0; (long)uVar22 < (long)pTVar15->count; uVar22 = uVar22 + 1) {
      if (0x1b < (uint)pTVar15->alphabet[uVar22]) {
        foundError();
        printf("*** ERROR *** Bad ALPHABETS_FOR_TERRITORY[%d].alphabet[%d]: %d\n",(ulong)(uint)TVar2
               ,uVar22 & 0xffffffff,(ulong)(uint)pTVar15->alphabet[uVar22]);
      }
    }
    iVar3 = iVar3 + (int)uVar22 + 1;
  }
  puts("-----------------------------------------------------------\nParser tests");
  uVar33 = extraout_RDX;
  for (lVar21 = 0; lVar21 != 0x78; lVar21 = lVar21 + 0x18) {
    pcVar16 = *(char **)((long)&testAlphabetParser_convertTests + lVar21);
    AVar24 = *(Alphabet *)((long)&DAT_002d98b8 + lVar21);
    convertMapcodeToAlphabetUtf8((char *)largeUnicodeString2,pcVar16,AVar24);
    iVar4 = strcmp((char *)largeUnicodeString2,
                   *(char **)((long)&PTR_anon_var_dwarf_33dd_002d98c0 + lVar21));
    uVar33 = extraout_RDX_00;
    if (iVar4 != 0) {
      foundError();
      printf("*** ERROR *** convertMapcodeToAlphabetUtf8(\"%s\",%d) returned \"%s\", (expected %s)\n"
             ,pcVar16,(ulong)(uint)AVar24,largeUnicodeString2);
      uVar33 = extraout_RDX_01;
    }
  }
  iStack_1601c = 5;
  for (lVar21 = 8; lVar21 != 0x98; lVar21 = lVar21 + 0x10) {
    pcVar16 = *(char **)((long)&PTR_anon_var_dwarf_3213_002d9818 + lVar21);
    MVar5 = myParseMapcodeString((MapcodeElements *)largeUnicodeString2,pcVar16,(Territory)uVar33);
    if (MVar5 == ERR_OK) {
      pcVar17 = "NLD 49.YV\t";
      if ((char)largeUnicodeString2[0xe] != '\0') {
        pcVar17 = " xx.xx-DD -";
      }
      sprintf(s1,"%s %s%s%s (%d;%d)",largeUnicodeString2,largeUnicodeString2 + 6,pcVar17 + 10,
              largeUnicodeString2 + 0xe,(ulong)(uint)largeUnicodeString2._8_4_,
              (ulong)(uint)largeUnicodeString2._24_4_);
      pcVar17 = *(char **)((long)&testAlphabetParser_parseTests + lVar21);
      iVar4 = strcmp(s1,pcVar17);
      if (iVar4 == 0) {
        pcVar17 = "NLD 49.YV\t";
        if ((char)largeUnicodeString2[0xe] != '\0') {
          pcVar17 = " xx.xx-DD -";
        }
        sprintf((char *)largeUnicodeString1,"%s %s%s%s",largeUnicodeString2,largeUnicodeString2 + 6,
                pcVar17 + 10,largeUnicodeString2 + 0xe);
        MVar5 = decodeMapcodeToLatLonUtf8
                          ((double *)largeString2,(double *)u1,pcVar16,TERRITORY_UNKNOWN,
                           (MapcodeElements *)0x0);
        MVar6 = decodeMapcodeToLatLonUtf8
                          ((double *)s1_1,&lon2,(char *)largeUnicodeString1,TERRITORY_UNKNOWN,
                           (MapcodeElements *)0x0);
        uVar33 = extraout_RDX_04;
        if (MVar5 != ERR_OK || MVar6 != ERR_OK) {
          foundError();
          printf("*** ERROR *** decoding \"%s\" returns %d, decoding \"%s\" returns %d\n",pcVar16,
                 (ulong)(uint)MVar5,largeUnicodeString1);
          uVar33 = extraout_RDX_05;
        }
        if (((double)largeString2._0_8_ != (double)CONCAT71(uStack_16017,s1_1[0])) ||
           (NAN((double)largeString2._0_8_) || NAN((double)CONCAT71(uStack_16017,s1_1[0])))) {
LAB_001ca82b:
          foundError();
          printf("*** ERROR *** decoding \"%s\" returns (%f,%f), decoding \"%s\" returns (%f,%f)\n",
                 largeString2._0_8_,_u1,CONCAT71(uStack_16017,s1_1[0]),lon2,pcVar16,
                 largeUnicodeString1);
          uVar33 = extraout_RDX_06;
        }
        else if ((_u1 != lon2) || (NAN(_u1) || NAN(lon2))) goto LAB_001ca82b;
        iStack_1601c = iStack_1601c + 3;
      }
      else {
        iStack_1601c = iStack_1601c + 2;
        foundError();
        printf("*** ERROR *** myParseMapcodeString(\"%s\") = \"%s\", (expected \"%s\")\n",pcVar16,s1
               ,pcVar17);
        uVar33 = extraout_RDX_03;
      }
    }
    else {
      iStack_1601c = iStack_1601c + 1;
      foundError();
      printf("*** ERROR *** myParseMapcodeString(\"%s\") failed with error %d (expected %s)\n",
             pcVar16,(ulong)(uint)MVar5,
             *(undefined8 *)((long)&testAlphabetParser_parseTests + lVar21));
      uVar33 = extraout_RDX_02;
    }
  }
  puts("-----------------------------------------------------------\nTerritory name tests");
  iVar4 = testGetFullTerritoryName();
  uStack_15fe8 = CONCAT44(extraout_var,iVar4);
  puts("-----------------------------------------------------------\nTerritory tests");
  __stream = fopen("territories.csv","r");
  if (__stream == (FILE *)0x0) {
    foundError();
    uVar9 = 0;
    printf("*** ERROR *** Can\'t read file %s\n","territories.csv");
  }
  else {
    pcVar16 = fgets((char *)largeUnicodeString2,0x200,__stream);
    if (pcVar16 != (char *)0x0) {
      uVar9 = 0;
      do {
        do {
          pcVar16 = fgets((char *)largeUnicodeString2,0x200,__stream);
          if (pcVar16 == (char *)0x0) goto LAB_001caaf7;
          pcVar16 = strchr((char *)largeUnicodeString2,0x2c);
        } while (pcVar16 == (char *)0x0);
        *pcVar16 = '\0';
        iVar4 = atoi((char *)largeUnicodeString2);
        TVar2 = iVar4 + TERRITORY_VAT;
        if (iVar4 < 0) {
          TVar2 = TERRITORY_NONE;
        }
        pcVar16 = pcVar16 + 1;
        pcVar17 = strchr(pcVar16,0x2c);
        if (pcVar17 != (char *)0x0) {
          *pcVar17 = '\0';
          while (*pcVar16 != '\0') {
            pcVar18 = strchr(pcVar16,0x7c);
            if (pcVar18 != (char *)0x0) {
              *pcVar18 = '\0';
            }
            TVar7 = getTerritoryCode(pcVar16,TERRITORY_NONE);
            if (TVar7 != TVar2) {
              foundError();
              printf("*** ERROR *** Territory string %s returns code %d, expected %d\n",pcVar16,
                     (ulong)(uint)TVar7,(ulong)(uint)TVar2);
            }
            pcVar16 = pcVar18 + 1;
            if (pcVar18 == (char *)0x0) {
              pcVar16 = pcVar17;
            }
          }
          pcVar16 = pcVar16 + 1;
        }
        pcVar17 = strchr(pcVar16,0x2c);
        if (pcVar17 != (char *)0x0) {
          pTVar15 = getAlphabetsForTerritory(TVar2);
          *pcVar17 = '\0';
          uVar22 = 0;
          while (*pcVar16 != '\0') {
            pcVar18 = strchr(pcVar16,0x7c);
            if (pcVar18 != (char *)0x0) {
              *pcVar18 = '\0';
            }
            if (((long)pTVar15->count <= (long)uVar22) ||
               (AVar24 = atoi(pcVar16), AVar24 != pTVar15->alphabet[uVar22])) {
              foundError();
              uVar8 = atoi(pcVar16);
              printf("*** ERROR *** Mismatch: alphabet %d of territory %d should be %d\n",
                     (ulong)((int)uVar22 + 1),(ulong)(uint)TVar2,(ulong)uVar8);
            }
            pcVar16 = pcVar18 + 1;
            if (pcVar18 == (char *)0x0) {
              pcVar16 = pcVar17;
            }
            uVar22 = uVar22 + 1;
          }
          if (pTVar15->count != (int)uVar22) {
            foundError();
            printf("*** ERROR *** %d alphabets for territory %d, expected %d\n",
                   (ulong)(uint)pTVar15->count,(ulong)(uint)TVar2,uVar22 & 0xffffffff);
          }
          pcVar16 = pcVar16 + 1;
        }
        uVar9 = uVar9 + 1;
        pcVar17 = strchr(pcVar16,10);
        if (pcVar17 != (char *)0x0) {
          *pcVar17 = '\0';
          iVar25 = 0;
          iVar4 = 0;
          while (iVar4 == 0) {
            iVar4 = getFullTerritoryNameInLocaleUtf8(s1,TVar2,iVar25,"en_US");
            pcVar17 = strstr(pcVar16,s1);
            if (pcVar17 == (char *)0x0) {
              foundError();
              printf("*** ERROR *** Name \"%s\" not found in \"%s\"\n",s1,pcVar16);
            }
            iVar25 = iVar25 + 1;
          }
        }
      } while( true );
    }
    uVar9 = 0;
LAB_001caaf7:
    fclose(__stream);
  }
  printf("%d lines tested from %s\n",(ulong)uVar9,"territories.csv");
  uStack_15ff8 = 0;
  lVar21 = 0;
  while (lVar21 != 0x3c4) {
    pcVar16 = TEST_TERRITORIES[lVar21].codeISO;
    TVar2 = TEST_TERRITORIES[lVar21].territory;
    iStack_15fec = TEST_TERRITORIES[lVar21].isAlias;
    iVar4 = TEST_TERRITORIES[lVar21].needsParent;
    TVar7 = TEST_TERRITORIES[lVar21].parent;
    uVar9 = 0;
    iVar25 = 0;
    lStack_15fe0 = lVar21;
    while( true ) {
      uVar22 = (ulong)uVar9;
      sVar14 = strlen(pcVar16);
      if (sVar14 < uVar22) break;
      strcpy(s1,pcVar16);
      if (uVar9 == 0 && iVar4 == 0) {
        TVar10 = getTerritoryCode(s1,TERRITORY_NONE);
        iVar25 = iVar25 + 1;
        if (TVar10 != TVar2) {
          foundError();
          getTerritoryIsoName((char *)largeUnicodeString2,TVar2,0);
          printf("*** ERROR *** getTerritoryCode(\'%s\')=%d but expected %d (%s)\n",s1,
                 (ulong)(uint)TVar10,(ulong)(uint)TVar2);
        }
      }
      pp_Var19 = __ctype_tolower_loc();
      s1[uVar22] = (char)(*pp_Var19)[s1[uVar22]];
      TVar10 = getTerritoryCode(s1,TVar7);
      if (TVar10 != TVar2) {
        foundError();
        pcVar17 = "";
        if (TVar7 != TERRITORY_UNKNOWN) {
          pcVar17 = getTerritoryIsoName((char *)largeUnicodeString2,TVar7,0);
        }
        printf("*** ERROR *** getTerritoryCode(\'%s\',%s)=%d but expected %d\n",s1,pcVar17,
               (ulong)(uint)TVar10);
      }
      iVar25 = iVar25 + 1;
      uVar9 = uVar9 + 1;
    }
    if (iStack_15fec == 0 && _TERRITORY_MIN < TVar7) {
      getTerritoryIsoName((char *)largeUnicodeString2,TVar2,0);
      iVar25 = iVar25 + 1;
      iVar4 = strcmp((char *)largeUnicodeString2,pcVar16);
      if ((iVar4 != 0) &&
         (iVar4 = strcmp((char *)((long)largeUnicodeString2 + 3),pcVar16), iVar4 != 0)) {
        foundError();
        printf("*** ERROR *** getTerritoryIsoName(%d)=\"%s\" which does not equal or contain \"%s\"\n"
               ,(ulong)(uint)TVar2,largeUnicodeString2,pcVar16);
      }
    }
    uStack_15ff8 = (ulong)(uint)((int)uStack_15ff8 + iVar25);
    lVar21 = lStack_15fe0 + 1;
  }
  pcVar16 = getTerritoryIsoName((char *)largeUnicodeString2,TERRITORY_NONE,0);
  if ((((*pcVar16 != '\0') ||
       (pcVar16 = getTerritoryIsoName((char *)largeUnicodeString2,TERRITORY_UNKNOWN,0),
       *pcVar16 != '\0')) ||
      (pcVar16 = getTerritoryIsoName((char *)largeUnicodeString2,_TERRITORY_MIN,0), *pcVar16 != '\0'
      )) || (pcVar16 = getTerritoryIsoName((char *)largeUnicodeString2,_TERRITORY_MAX,0),
            *pcVar16 != '\0')) {
    foundError();
    puts("*** ERROR *** getTerritoryIsoName returned nonempty for bad arguments");
  }
  TVar2 = getTerritoryCode((char *)0x0,TERRITORY_VAT);
  if (TVar2 != TERRITORY_NONE) {
    foundError();
    puts("*** ERROR *** unexpected getTerritoryCode return for bad arguments");
  }
  pcVar16 = getTerritoryIsoName((char *)largeUnicodeString2,TERRITORY_US_CA,1);
  if ((((*pcVar16 == 'C') && (pcVar16[1] == 'A')) &&
      ((pcVar16[2] == '\0' &&
       ((pcVar16 = getTerritoryIsoName((char *)largeUnicodeString2,TERRITORY_IN_DD,1),
        *pcVar16 == 'D' && (pcVar16[1] == 'D')))))) && (pcVar16[2] == '\0')) {
    pcVar16 = getTerritoryIsoName((char *)largeUnicodeString2,TERRITORY_NLD,1);
    iVar4 = strcmp(pcVar16,"NLD");
    if (iVar4 == 0) {
      pcVar16 = getTerritoryIsoName((char *)largeUnicodeString2,TERRITORY_USA,1);
      iVar4 = strcmp(pcVar16,"USA");
      if (iVar4 == 0) goto LAB_001cae34;
    }
  }
  foundError();
  puts("*** ERROR *** getTerritoryIsoName returned bad short versions");
LAB_001cae34:
  for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
    TVar2 = (&testTerritoryCode_ptcTestData)[lVar21 * 2];
    TVar7 = getParentCountryOf(TVar2);
    if (TVar7 != (&DAT_001d1144)[lVar21 * 2]) {
      foundError();
      printf("*** ERROR *** getParentCountryOf(%d) returned unexpected %d\n",(ulong)(uint)TVar2,
             (ulong)(uint)TVar7);
    }
  }
  for (lVar21 = 8; lVar21 != 0x178; lVar21 = lVar21 + 0x10) {
    pcVar16 = *(char **)((long)&testTerritoryCode_tcTestData + lVar21);
    TVar2 = *(Territory *)((long)&TEST_TERRITORIES[0x3c3].needsParent + lVar21);
    TVar7 = *(Territory *)((long)&TEST_TERRITORIES[0x3c3].parent + lVar21);
    TVar10 = getTerritoryCode(pcVar16,TVar7);
    if (TVar10 != TVar2) {
      foundError();
      printf("*** ERROR *** getTerritoryCode(\"%s\", %d)=%d, expected %d\n",pcVar16,
             (ulong)(uint)TVar7,(ulong)(uint)TVar10);
    }
  }
  for (lVar21 = 0x18; lVar21 != 0x3f8; lVar21 = lVar21 + 0x20) {
    pcVar16 = *(char **)(&UNK_002df4f8 + lVar21);
    TVar2 = getTerritoryCode(pcVar16,TERRITORY_NONE);
    dVar31 = *(double *)(&UNK_002df500 + lVar21);
    uVar8 = multipleBordersNearby(dVar31,*(double *)(&UNK_002df508 + lVar21),TVar2);
    uVar9 = *(uint *)((long)&DAT_002df510 + lVar21);
    if (uVar8 != uVar9) {
      foundError();
      printf("*** ERROR *** multipleBordersNearby(%+18.13f,%+18.13f, \"%s\") not %d\n",dVar31,
             pcVar16,(ulong)uVar9);
    }
  }
  puts("-----------------------------------------------------------\nDistance tests");
  dVar31 = maxErrorInMeters(99);
  if ((dVar31 != 0.0) || (NAN(dVar31))) {
    foundError();
    maxErrorInMeters(99);
    printf("*** ERROR *** maxErrorInMeters(99) = %f (expected 0.0)\n");
  }
  dVar31 = distanceInMeters(0.0,0.0,0.0,1.5);
  testDistance(166979.23618950002,dVar31);
  dVar31 = distanceInMeters(0.0,0.0,0.0,2.0);
  testDistance(222638.981586,dVar31);
  dVar31 = distanceInMeters(0.0,0.0,0.0,2.5);
  testDistance(278298.7269825,dVar31);
  dVar31 = distanceInMeters(0.0,-1.0,0.0,0.5);
  testDistance(166979.23618950002,dVar31);
  dVar31 = distanceInMeters(0.0,-1.0,0.0,1.0);
  testDistance(222638.981586,dVar31);
  dVar31 = distanceInMeters(0.0,-1.0,0.0,1.5);
  testDistance(278298.7269825,dVar31);
  dVar31 = distanceInMeters(0.0,0.5,0.0,-1.0);
  testDistance(166979.23618950002,dVar31);
  dVar31 = distanceInMeters(0.0,1.0,0.0,-1.0);
  testDistance(222638.981586,dVar31);
  dVar31 = distanceInMeters(0.0,1.5,0.0,-1.0);
  testDistance(278298.7269825,dVar31);
  dVar31 = distanceInMeters(0.0,359.0,0.0,0.5);
  testDistance(166979.23618950002,dVar31);
  dVar31 = distanceInMeters(0.0,359.0,0.0,1.0);
  testDistance(222638.981586,dVar31);
  dVar31 = distanceInMeters(0.0,359.0,0.0,1.5);
  testDistance(278298.7269825,dVar31);
  dVar31 = distanceInMeters(0.0,0.5,0.0,359.0);
  testDistance(166979.23618950002,dVar31);
  dVar31 = distanceInMeters(0.0,1.0,0.0,359.0);
  testDistance(222638.981586,dVar31);
  dVar31 = distanceInMeters(0.0,1.5,0.0,359.0);
  testDistance(278298.7269825,dVar31);
  dVar31 = distanceInMeters(0.5,0.0,-0.5,0.0);
  testDistance(110946.252133,dVar31);
  dVar31 = distanceInMeters(1.0,0.0,-0.0,0.0);
  testDistance(110946.252133,dVar31);
  dVar31 = distanceInMeters(0.0,0.0,-1.0,0.0);
  testDistance(110946.252133,dVar31);
  for (uVar22 = 0; (int)uVar22 != 0x4b; uVar22 = uVar22 + 5) {
    dVar31 = distanceInMeters((double)(&testDistances_coordpairs)[uVar22],
                              (double)(&DAT_001d11c8)[uVar22],(double)(&DAT_001d11d0)[uVar22],
                              (double)(&DAT_001d11d8)[uVar22]);
    dVar32 = floor(dVar31 * 100000.0 + 0.5);
    if ((dVar32 != (double)(&DAT_001d11e0)[uVar22]) ||
       (NAN(dVar32) || NAN((double)(&DAT_001d11e0)[uVar22]))) {
      foundError();
      printf("*** ERROR *** distanceInMeters %d failed: %f\n",dVar31,uVar22 & 0xffffffff);
    }
  }
  puts("-----------------------------------------------------------\nMapcode format tests");
  iStack_16030 = (int)uStack_15fe8 + iVar3 + iStack_1601c + (int)uStack_15ff8 + 0x13de;
  uVar28 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar33 = extraout_RDX_07;
  for (pMVar23 = &DAT_002df8fc; pcVar16 = *(char **)(pMVar23 + -3), pcVar16 != (char *)0x0;
      pMVar23 = pMVar23 + 4) {
    MVar6 = myParseMapcodeString((MapcodeElements *)largeUnicodeString2,pcVar16,(Territory)uVar33);
    MVar11 = compareWithMapcodeFormatUtf8(pcVar16);
    MVar5 = pMVar23[-1];
    uVar9 = uVar9 + (MVar5 == ERR_OK);
    uVar33 = extraout_RDX_08;
    if ((MVar6 != MVar11) && (MVar5 != ERR_UNKNOWN_TERRITORY || MVar11 != ERR_OK)) {
      foundError();
      printf("*** ERROR *** \"%s\" : myParseMapcodeString=%d, compareWithMapcodeFormatUtf8=%d\n",
             pcVar16,(ulong)(uint)MVar6);
      uVar33 = extraout_RDX_09;
    }
    if (MVar5 != MVar6) {
      foundError();
      printf("*** ERROR *** compareWithMapcodeFormatUtf8(\"%s\") returns %d (%d expected)\n",pcVar16
             ,(ulong)(uint)MVar6);
      uVar33 = extraout_RDX_10;
    }
    if (MVar6 == ERR_OK) {
      MVar5 = decodeMapcodeToLatLonUtf8
                        ((double *)s1,(double *)largeUnicodeString1,pcVar16,TERRITORY_UNKNOWN,
                         (MapcodeElements *)0x0);
      uVar33 = extraout_RDX_11;
      if (MVar5 != *pMVar23) {
        foundError();
        printf("*** ERROR *** myParseMapcodeString(\"%s\")=%d, expected %d\n",pcVar16,
               (ulong)(uint)MVar5);
        uVar33 = extraout_RDX_12;
      }
      uVar8 = uVar8 + 1;
    }
    uVar28 = uVar28 + 1;
    iStack_16030 = iStack_16030 + 3;
  }
  if (uVar8 != uVar9) {
    foundError();
    printf("*** ERROR *** %d of %d myParseMapcodeString() calls succeeded (expected %d)\n",
           (ulong)uVar8,(ulong)uVar28);
  }
  for (lVar21 = 0; lVar21 != 0x1b8; lVar21 = lVar21 + 8) {
    pcVar16 = *(char **)((long)&testFailingDecodes_badcodes + lVar21);
    MVar5 = decodeMapcodeToLatLonUtf8
                      ((double *)largeUnicodeString2,(double *)s1,pcVar16,TERRITORY_UNKNOWN,
                       (MapcodeElements *)0x0);
    if (~ERR_OK < MVar5) {
      foundError();
      printf("*** ERROR *** invalid mapcode \"%s\" decodes without error\n",pcVar16);
    }
  }
  puts("-----------------------------------------------------------\nEncode/decode tests");
  for (lVar21 = 0x18; lVar21 != 0x78; lVar21 = lVar21 + 0x20) {
    pcVar16 = *(char **)((long)&DAT_002e0d00 + lVar21);
    encodeLatLonToSingleMapcode
              ((char *)largeUnicodeString2,
               *(double *)((long)&PTR_anon_var_dwarf_5346_002e0ce8 + lVar21),
               *(double *)((long)&PTR_anon_var_dwarf_6178_002e0cf0 + lVar21),
               *(Territory *)(&UNK_002e0cf8 + lVar21),4);
    iVar3 = strcmp((char *)largeUnicodeString2,pcVar16);
    if (iVar3 != 0) {
      printf("*** ERROR *** encodeLatLonToSingleMapcode()=%s, expected %s\n",largeUnicodeString2,
             pcVar16);
    }
  }
  uVar22 = 0;
  do {
    uVar9 = encodeLatLonToSelectedMapcode
                      ((char *)largeUnicodeString2,52.158993,4.492346,TERRITORY_NONE,0,(int)uVar22);
    if (uVar9 != 4) {
      foundError();
      printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d",4,
             (ulong)uVar9);
    }
    switch(uVar22) {
    case 0:
      iVar3 = bcmp(largeUnicodeString2,"NLD QJM.0G",0xb);
      if (iVar3 != 0) {
        foundError();
        pcVar16 = "NLD QJM.0G";
        uVar33 = 0;
LAB_001cb653:
        printf("*** ERROR *** testSelectedEncodes, expected \'%s\', but got \'%s\', alternative %d\n"
               ,pcVar16,largeUnicodeString2,uVar33);
      }
      break;
    case 1:
      iVar3 = bcmp(largeUnicodeString2,"NLD CZQ.15C",0xc);
      if (iVar3 != 0) {
        foundError();
        pcVar16 = "NLD CZQ.15C";
        uVar33 = 1;
        goto LAB_001cb653;
      }
      break;
    case 2:
      iVar3 = bcmp(largeUnicodeString2,"NLD N39J.MZN",0xd);
      if (iVar3 != 0) {
        foundError();
        pcVar16 = "NLD N39J.MZN";
        uVar33 = 2;
        goto LAB_001cb653;
      }
      break;
    case 3:
      iVar3 = bcmp(largeUnicodeString2,"VHVN4.TZ9S",0xb);
      if (iVar3 != 0) {
        foundError();
        pcVar16 = "VHVN4.TZ9S";
        uVar33 = 3;
        goto LAB_001cb653;
      }
      break;
    default:
      foundError();
      printf("*** ERROR *** testSelectedEncodes, expected %d alternatives, but got %d",4,uVar22);
    }
    uVar8 = (int)uVar22 + 1;
    uVar22 = (ulong)uVar8;
    if ((int)uVar9 <= (int)uVar8) {
      printf("%d encodes\n",0x3dee);
      ppcVar29 = &ENCODE_TEST[0].mapcode;
      iVar3 = 0;
      for (lVar21 = 0; lVar21 != 0x3dee; lVar21 = lVar21 + 1) {
        showTestProgress((int)lVar21,0x3dee,iVar3);
        iVar4 = testEncodeAndDecode(*ppcVar29,((EncodeTestRecord *)(ppcVar29 + -3))->latitude,
                                    (double)ppcVar29[-2],*(int *)(ppcVar29 + -1),
                                    *(int *)((long)ppcVar29 + -4));
        iVar3 = iVar3 + iVar4;
        ppcVar29 = ppcVar29 + 4;
      }
      puts("-----------------------------------------------------------\nRe-encode tests");
      iVar4 = 0;
      printf("%d records\n",0x3fe4);
      lVar21 = 0x3e9;
      do {
        if (lVar21 == 0x5fe) {
LAB_001cb7e9:
          puts("-----------------------------------------------------------");
          printf("Done.\nExecuted %d tests, found %d errors\n",
                 (ulong)(uint)(iVar4 + iVar3 + iStack_16030),(ulong)(uint)nrErrors);
          pcVar16 = "Unit tests passed";
          if (0 < nrErrors) {
            pcVar16 = "UNIT TESTS FAILED!";
          }
          puts(pcVar16);
          return nrErrors;
        }
        lVar27 = (long)*(int *)(_fini + lVar21 * 4 + 4);
        iVar25 = *(int *)(lVar21 * 4 + 0x1d0480);
        showTestProgress(iVar25,0x3fe4,iVar4);
        pTVar30 = TERRITORY_BOUNDARIES + lVar27;
        iVar26 = 0;
        for (; lVar27 < iVar25; lVar27 = lVar27 + 1) {
          lVar20 = (long)iVar26;
          puVar13 = largeUnicodeString2 + lVar20 * 8;
          puVar13[0] = 0;
          puVar13[1] = 0;
          *(TerritoryBoundary **)(largeUnicodeString2 + lVar20 * 8 + 4) = pTVar30;
          iVar12 = pthread_create((pthread_t *)(s1 + lVar20 * 8),(pthread_attr_t *)0x0,
                                  executeTestAround,puVar13);
          if (iVar12 != 0) {
            foundError();
            puts("*** ERROR *** Cannot create thread");
            iVar4 = 0;
            goto LAB_001cb7e9;
          }
          iVar12 = iVar26 + 1;
          bVar1 = 0xe < iVar26;
          iVar26 = iVar12;
          if (bVar1) {
            iVar26 = joinThreads((pthread_t *)s1,(ContextTestAround *)largeUnicodeString2,iVar12);
            iVar4 = iVar4 + iVar26;
            iVar26 = 0;
          }
          pTVar30 = pTVar30 + 1;
        }
        iVar25 = joinThreads((pthread_t *)s1,(ContextTestAround *)largeUnicodeString2,iVar26);
        iVar4 = iVar4 + iVar25;
        lVar21 = lVar21 + 1;
      } while( true );
    }
  } while( true );
}

Assistant:

int main(const int argc, const char **argv) {
    int nrTests = 0;

    // Ref unused var.
    REF(ISO3166_ALPHA[0]);

    printf("Mapcode C Library Unit Tests\n");
    printf("Library version %s (data version %s)\n", MAPCODE_C_VERSION, MAPCODE_DATA_VERSION);
#ifdef NO_POSIX_THREADS
    printf("Compiler options: NO_POSIX_THREADS\n");
#else
    printf("Using up to %d threads to test in parallel...\n", MAX_THREADS);
#endif

    if (argc != 1 || argv == NULL) {
        printf("*** ERROR *** unittest takes no arguments!\n");
        exit(1);
    }

    printf("-----------------------------------------------------------\nEnvironment tests\n");
    nrTests += testEnvironment();

    printf("-----------------------------------------------------------\nRobustness tests\n");
    nrTests += testRobustness();

    printf("-----------------------------------------------------------\nAlphabet tests\n");
    nrTests += testAlphabetRobustness();
    nrTests += testAlphabets();

    printf("-----------------------------------------------------------\nAlphabet per territory tests\n");
    nrTests += testAlphabetPerTerritory();

    printf("-----------------------------------------------------------\nParser tests\n");
    nrTests += testAlphabetParser();

    printf("-----------------------------------------------------------\nTerritory name tests\n");
    nrTests += testGetFullTerritoryName();

    printf("-----------------------------------------------------------\nTerritory tests\n");
    nrTests += testTerritoriesCsv();
    nrTests += testTerritories();
    nrTests += testTerritoryCode();
    nrTests += testTerritoryInsides();

    printf("-----------------------------------------------------------\nDistance tests\n");
    nrTests += testDistances();

    printf("-----------------------------------------------------------\nMapcode format tests\n");
    nrTests += testMapcodeFormats();
    nrTests += testFailingDecodes();

    printf("-----------------------------------------------------------\nEncode/decode tests\n");
    nrTests += testSingleEncodes();
    nrTests += testSelectedEncodes();
    nrTests += testEncodeDecode();

    printf("-----------------------------------------------------------\nRe-encode tests\n");
    nrTests += testReEncode();

    printf("-----------------------------------------------------------\n");
    printf("Done.\nExecuted %d tests, found %d errors\n", nrTests, nrErrors);
    if (nrErrors > 0) {
        printf("UNIT TESTS FAILED!\n");
    } else {
        printf("Unit tests passed\n");
    }
    return nrErrors;
}